

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::updateSize(QTipLabel *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int extraout_EDX;
  long lVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QArrayDataPointer<char16_t> local_48;
  QFontMetrics fm;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetPrivate::setScreenForPoint
            (*(QWidgetPrivate **)&(this->super_QLabel).super_QFrame.super_QWidget.field_0x8,pos);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&fm,&((this->super_QLabel).super_QFrame.super_QWidget.data)->fnt);
  iVar3 = QFontMetrics::descent();
  if (iVar3 == 2) {
    iVar3 = QFontMetrics::ascent();
    lVar5 = (ulong)(10 < iVar3) << 0x20;
  }
  else {
    lVar5 = 0;
  }
  QLabel::text((QString *)&local_48,&this->super_QLabel);
  QVar6.m_size = local_48.size | 0x8000000000000000;
  QVar6.field_0.m_data_utf16 = local_48.ptr;
  bVar2 = (bool)Qt::mightBeRichText(QVar6);
  QLabel::setWordWrap(&this->super_QLabel,bVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  lVar4 = (**(code **)(*(long *)&(this->super_QLabel).super_QFrame.super_QWidget + 0x70))(this);
  getTipScreen(pos,(QWidget *)this);
  bVar2 = QLabel::wordWrap(&this->super_QLabel);
  if (!bVar2) {
    iVar3 = QScreen::geometry();
    if ((extraout_EDX - iVar3) + 1 < (int)lVar4) {
      QLabel::setWordWrap(&this->super_QLabel,true);
      lVar4 = (**(code **)(*(long *)&(this->super_QLabel).super_QFrame.super_QWidget + 0x70))(this);
    }
  }
  local_48.d = (Data *)((ulong)((int)lVar4 + 1) | lVar5 + lVar4 & 0xffffffff00000000U);
  QWidget::resize((QWidget *)this,(QSize *)&local_48);
  QFontMetrics::~QFontMetrics(&fm);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void  QTipLabel::updateSize(const QPoint &pos)
{
    d_func()->setScreenForPoint(pos);
    // Ensure that we get correct sizeHints by placing this window on the right screen.
    QFontMetrics fm(font());
    QSize extra(1, 0);
    // Make it look good with the default ToolTip font on Mac, which has a small descent.
    if (fm.descent() == 2 && fm.ascent() >= 11)
        ++extra.rheight();
    setWordWrap(Qt::mightBeRichText(text()));
    QSize sh = sizeHint();
    const QScreen *screen = getTipScreen(pos, this);
    if (!wordWrap() && sh.width() > screen->geometry().width()) {
        setWordWrap(true);
        sh = sizeHint();
    }
    resize(sh + extra);
}